

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O0

void __thiscall
RegisterCLParserTestParseSystemInclude::RegisterCLParserTestParseSystemInclude
          (RegisterCLParserTestParseSystemInclude *this)

{
  RegisterCLParserTestParseSystemInclude *this_local;
  
  RegisterTest(CLParserTestParseSystemInclude::Create,"CLParserTest.ParseSystemInclude");
  return;
}

Assistant:

TEST(CLParserTest, ParseSystemInclude) {
  CLParser parser;
  string output, err;
  ASSERT_TRUE(parser.Parse(
      "Note: including file: c:\\Program Files\\foo.h\r\n"
      "Note: including file: d:\\Microsoft Visual Studio\\bar.h\r\n"
      "Note: including file: path.h\r\n",
      "", &output, &err));
  // We should have dropped the first two includes because they look like
  // system headers.
  ASSERT_EQ("", output);
  ASSERT_EQ(1u, parser.includes_.size());
  ASSERT_EQ("path.h", *parser.includes_.begin());
}